

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBoneParent(OgreBinarySerializer *this,Skeleton *skeleton)

{
  uint16_t id;
  uint16_t id_00;
  Bone *bone;
  Bone *this_00;
  DeadlyImportError *this_01;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  id = Read<unsigned_short>(this);
  id_00 = Read<unsigned_short>(this);
  bone = Skeleton::BoneById(skeleton,id);
  this_00 = Skeleton::BoneById(skeleton,id_00);
  if ((bone != (Bone *)0x0) && (this_00 != (Bone *)0x0)) {
    Bone::AddChild(this_00,bone);
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,"Failed to find bones for parenting: Child id ");
  std::ostream::operator<<(local_1a0,id);
  std::operator<<((ostream *)local_1a0," for parent id ");
  std::ostream::operator<<(local_1a0,id_00);
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(this_01,&local_1c0);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadBoneParent(Skeleton *skeleton)
{
    uint16_t childId = Read<uint16_t>();
    uint16_t parentId = Read<uint16_t>();

    Bone *child = skeleton->BoneById(childId);
    Bone *parent = skeleton->BoneById(parentId);

    if (child && parent)
        parent->AddChild(child);
    else
        throw DeadlyImportError(Formatter::format() << "Failed to find bones for parenting: Child id " << childId << " for parent id " << parentId);
}